

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::DataCollectionStart(AmpIO *this,uchar chan,CollectCallback collectCB)

{
  uint32_t uVar1;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (6 < uVar1) {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x44514c41) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"AmpIO::DataCollectionStart not implemented for DQLA",0x33);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
    }
    else if ((chan != '\0') && ((uint)chan <= this->NumMotors)) {
      this->collect_state = true;
      this->collect_chan = chan;
      this->collect_rindex = 0;
      this->collect_cb = collectCB;
      return true;
    }
  }
  return false;
}

Assistant:

bool AmpIO::DataCollectionStart(unsigned char chan, CollectCallback collectCB)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String) {
        std::cerr << "AmpIO::DataCollectionStart not implemented for DQLA" << std::endl;
        return false;
    }
    if ((chan < 1) || (chan > NumMotors)) return false;
    collect_state = true;
    collect_chan = chan;
    collect_rindex = 0;
    collect_cb = collectCB;
    return true;
}